

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_arguments_and_rest.cpp
# Opt level: O2

void show_list<int,double>(int *value,double *args)

{
  ostream *poVar1;
  
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,*value);
  std::operator<<(poVar1,", ");
}

Assistant:

void show_list(const T & value, const Args & ...args) { // unpack params pack, and apply 'const &' pattern
    std::cout << value << ", ";
    //  recursive calling this function, each time to decrease one arg
    show_list(args...);
}